

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
* __thiscall
google::
sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::equal_range<char_const*>
          (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *__return_storage_ptr__,
          sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          *this,char **key)

{
  long lVar1;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  iterator *piVar3;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *ppVar4;
  byte bVar5;
  iterator pos;
  iterator local_b0;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_68;
  
  bVar5 = 0;
  find<char_const*>(&local_b0,this,key);
  local_68.pos.row_begin._M_current =
       *(sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)(this + 0x60);
  local_68.pos.row_end._M_current =
       *(sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)(this + 0x68);
  local_68.pos.col_current = (nonempty_iterator)0x0;
  local_68.end.col_current = (nonempty_iterator)0x0;
  local_68.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)this;
  local_68.pos.row_current._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_begin._M_current = local_68.pos.row_begin._M_current;
  local_68.end.row_end._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_current._M_current = local_68.pos.row_end._M_current;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_68);
  if ((((local_b0.pos.row_begin._M_current == local_68.pos.row_begin._M_current) &&
       (local_b0.pos.row_end._M_current == local_68.pos.row_end._M_current)) &&
      (local_b0.pos.row_current._M_current == local_68.pos.row_current._M_current)) &&
     ((local_b0.pos.row_current._M_current == local_b0.pos.row_end._M_current ||
      (local_b0.pos.col_current == local_68.pos.col_current)))) {
    piVar3 = &local_b0;
    ppVar4 = __return_storage_ptr__;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      (ppVar4->first).ht = piVar3->ht;
      piVar3 = (iterator *)((long)piVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      ppVar4 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  else {
    psVar2 = &local_b0;
    ppVar4 = __return_storage_ptr__;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      (ppVar4->first).ht = psVar2->ht;
      psVar2 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar2 + (ulong)bVar5 * -0x10 + 8);
      ppVar4 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator++(&local_b0);
  }
  piVar3 = &local_b0;
  psVar2 = &__return_storage_ptr__->second;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    psVar2->ht = piVar3->ht;
    piVar3 = (iterator *)((long)piVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    psVar2 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar2 + (ulong)bVar5 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const K& key) {
    iterator pos = find(key);  // either an iterator or end
    if (pos == end()) {
      return std::pair<iterator, iterator>(pos, pos);
    } else {
      const iterator startpos = pos++;
      return std::pair<iterator, iterator>(startpos, pos);
    }
  }